

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_graph.cpp
# Opt level: O0

ListGraph * load_pace_graph_impl(istream *in)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  istream *piVar6;
  ulong uVar7;
  char *pcVar8;
  istream *piVar9;
  long *plVar10;
  int *piVar11;
  runtime_error *prVar12;
  istream *in_RSI;
  ListGraph *in_RDI;
  int t;
  int h;
  int arc_count;
  int node_count;
  string sp;
  string p;
  istringstream lin;
  bool was_header_read;
  int next_arc;
  int line_num;
  string line;
  ListGraph *graph;
  ListGraph *in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  int in_stack_fffffffffffffa98;
  int in_stack_fffffffffffffa9c;
  ListGraph *in_stack_fffffffffffffaa0;
  int in_stack_fffffffffffffac0;
  int in_stack_fffffffffffffac4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac8;
  int *in_stack_fffffffffffffad8;
  int iVar13;
  string local_3c8 [39];
  undefined1 local_3a1;
  string local_320 [39];
  undefined1 local_2f9;
  string local_278 [32];
  int local_258;
  int local_254 [13];
  int local_220;
  int local_21c;
  string local_218 [32];
  string local_1f8 [32];
  istringstream local_1d8 [407];
  byte local_41;
  int local_40;
  int local_3c;
  string local_38 [39];
  byte local_11;
  istream *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  ListGraph::ListGraph((ListGraph *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
  std::__cxx11::string::string(local_38);
  local_3c = 0;
  local_40 = 0;
  local_41 = 0;
  do {
    do {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_10,local_38);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
      iVar13 = (int)((ulong)in_stack_fffffffffffffad8 >> 0x20);
      if (!bVar1) {
        iVar3 = local_40;
        iVar4 = ListGraph::arc_count((ListGraph *)0x151a49);
        if (iVar3 == iVar4) {
          local_11 = 1;
          std::__cxx11::string::~string(local_38);
          if ((local_11 & 1) == 0) {
            ListGraph::~ListGraph((ListGraph *)CONCAT44(iVar3,in_stack_fffffffffffffa90));
          }
          return in_RDI;
        }
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        iVar5 = ListGraph::arc_count((ListGraph *)0x151a82);
        std::__cxx11::to_string(iVar13);
        std::operator+((char *)CONCAT44(in_stack_fffffffffffffa9c,iVar4),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(iVar3,iVar5));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa9c,iVar4),(char *)CONCAT44(iVar3,iVar5));
        std::__cxx11::to_string(iVar13);
        std::operator+(in_stack_fffffffffffffac8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa9c,iVar4),(char *)CONCAT44(iVar3,iVar5));
        std::runtime_error::runtime_error(prVar12,local_3c8);
        __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_3c = local_3c + 1;
      uVar7 = std::__cxx11::string::empty();
    } while (((uVar7 & 1) != 0) ||
            (pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_38), *pcVar8 == 'c'));
    std::__cxx11::istringstream::istringstream(local_1d8,local_38,8);
    if ((local_41 & 1) == 0) {
      local_41 = 1;
      std::__cxx11::string::string(local_1f8);
      std::__cxx11::string::string(local_218);
      piVar6 = std::operator>>((istream *)local_1d8,local_1f8);
      piVar6 = std::operator>>(piVar6,local_218);
      piVar9 = (istream *)std::istream::operator>>((istream *)piVar6,&local_21c);
      plVar10 = (long *)std::istream::operator>>(piVar9,&local_220);
      bVar2 = std::ios::operator!((ios *)((long)plVar10 + *(long *)(*plVar10 + -0x18)));
      if ((bVar2 & 1) != 0) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar12,"Can not parse header in pace file.");
        __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                              (char *)in_stack_fffffffffffffa88);
      if ((((bVar1) ||
           (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90)
                                    ,(char *)in_stack_fffffffffffffa88), bVar1)) || (local_21c < 0))
         || (local_220 < 0)) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar12,"Invalid header in pace file.");
        __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      ListGraph::ListGraph
                (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98);
      ListGraph::operator=
                ((ListGraph *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                 in_stack_fffffffffffffa88);
      ListGraph::~ListGraph
                ((ListGraph *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
      std::__cxx11::string::~string(local_218);
      std::__cxx11::string::~string(local_1f8);
    }
    else {
      piVar9 = (istream *)std::istream::operator>>((istream *)local_1d8,&local_258);
      plVar10 = (long *)std::istream::operator>>(piVar9,local_254);
      bVar2 = std::ios::operator!((ios *)((long)plVar10 + *(long *)(*plVar10 + -0x18)));
      iVar13 = (int)((ulong)in_stack_fffffffffffffad8 >> 0x20);
      if ((bVar2 & 1) != 0) {
        local_2f9 = 1;
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(iVar13);
        std::operator+((char *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                       (char *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                       (char *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
        std::runtime_error::runtime_error(prVar12,local_278);
        local_2f9 = 0;
        __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar3 = local_254[0] + -1;
      local_258 = local_258 + -1;
      local_254[0] = iVar3;
      if (iVar3 < 0) {
LAB_00151709:
        local_3a1 = 1;
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(iVar13);
        std::operator+((char *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                       (char *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                       (char *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
        std::runtime_error::runtime_error(prVar12,local_320);
        local_3a1 = 0;
        __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar5 = ListGraph::node_count((ListGraph *)0x1516bf);
      iVar4 = local_258;
      iVar13 = (int)((ulong)in_stack_fffffffffffffad8 >> 0x20);
      if ((iVar5 <= iVar3) || (local_258 < 0)) goto LAB_00151709;
      iVar5 = ListGraph::node_count((ListGraph *)0x1516f3);
      iVar3 = local_40;
      iVar13 = (int)((ulong)in_stack_fffffffffffffad8 >> 0x20);
      if (iVar5 <= iVar4) goto LAB_00151709;
      iVar4 = ListGraph::arc_count((ListGraph *)0x1518e4);
      iVar13 = local_254[0];
      if (iVar3 < iVar4) {
        in_stack_fffffffffffffad8 =
             ArrayIDFunc<int>::operator[]((ArrayIDFunc<int> *)in_RDI,local_40);
        *in_stack_fffffffffffffad8 = iVar13;
        in_stack_fffffffffffffac4 = local_258;
        in_stack_fffffffffffffac8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ArrayIDFunc<int>::operator[](&(in_RDI->tail).super_ArrayIDFunc<int>,local_40);
        *(int *)in_stack_fffffffffffffac8 = in_stack_fffffffffffffac4;
      }
      iVar3 = local_40 + 1;
      local_40 = iVar3;
      in_stack_fffffffffffffac0 = ListGraph::arc_count((ListGraph *)0x151984);
      iVar13 = local_258;
      if (iVar3 < in_stack_fffffffffffffac0) {
        piVar11 = ArrayIDFunc<int>::operator[]((ArrayIDFunc<int> *)in_RDI,local_40);
        *piVar11 = iVar13;
        in_stack_fffffffffffffa9c = local_254[0];
        in_stack_fffffffffffffaa0 =
             (ListGraph *)
             ArrayIDFunc<int>::operator[](&(in_RDI->tail).super_ArrayIDFunc<int>,local_40);
        (in_stack_fffffffffffffaa0->head).super_ArrayIDFunc<int>.preimage_count_ =
             in_stack_fffffffffffffa9c;
      }
      local_40 = local_40 + 1;
    }
    std::__cxx11::istringstream::~istringstream(local_1d8);
  } while( true );
}

Assistant:

static ListGraph load_pace_graph_impl(std::istream& in)
{
    ListGraph graph;
    std::string line;
    int line_num = 0;
    int next_arc = 0;

    bool was_header_read = false;
    while (std::getline(in, line)) {
        ++line_num;
        if (line.empty() || line[0] == 'c')
            continue;

        std::istringstream lin(line);
        if (!was_header_read) {
            was_header_read = true;
            std::string p, sp;
            int node_count;
            int arc_count;
            if (!(lin >> p >> sp >> node_count >> arc_count))
                throw std::runtime_error("Can not parse header in pace file.");
            if (p != "p" || sp != "tdp" || node_count < 0 || arc_count < 0)
                throw std::runtime_error("Invalid header in pace file.");
            graph = ListGraph(node_count, 2 * arc_count);
        } else {
            int h, t;
            if (!(lin >> t >> h))
                throw std::runtime_error("Can not parse line num " + std::to_string(line_num) + " \"" + line + "\" in pace file.");
            --h;
            --t;
            if (h < 0 || h >= graph.node_count() || t < 0 || t >= graph.node_count())
                throw std::runtime_error("Invalid arc in line num " + std::to_string(line_num) + " \"" + line + "\" in pace file.");
            if (next_arc < graph.arc_count()) {
                graph.head[next_arc] = h;
                graph.tail[next_arc] = t;
            }
            ++next_arc;
            if (next_arc < graph.arc_count()) {
                graph.head[next_arc] = t;
                graph.tail[next_arc] = h;
            }
            ++next_arc;
        }
    }

    if (next_arc != graph.arc_count())
        throw std::runtime_error(
            "The arc count in the header (" + std::to_string(graph.arc_count()) + ") does not correspond with the actual number of arcs (" + std::to_string(next_arc) + ").");

    return graph; // NVRO
}